

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O1

target_ulong_conflict
helper_extpdp_mips(target_ulong_conflict ac,target_ulong_conflict size,CPUMIPSState_conflict *env)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  target_ulong_conflict tVar5;
  
  uVar3 = size & 0x1f;
  uVar1 = (env->active_tc).DSPControl;
  uVar4 = ~uVar3 + (uVar1 & 0x3f);
  if ((int)uVar4 < -1) {
    tVar5 = uVar1 | 0x4000;
    uVar3 = 0;
  }
  else {
    iVar2 = (uVar1 & 0x3f) - uVar3;
    if ((iVar2 < 0) || (0x40U - iVar2 <= uVar3)) {
      __assert_fail("start >= 0 && length > 0 && length <= 64 - start",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                    ,0x158,"uint64_t extract64(uint64_t, int, int)");
    }
    uVar3 = (uint)(0xffffffffffffffff >> (~(byte)uVar3 & 0x3f)) &
            (uint)(CONCAT44((env->active_tc).HI[ac],(env->active_tc).LO[ac]) >> ((byte)iVar2 & 0x3f)
                  );
    tVar5 = uVar4 & 0x3f | uVar1 & 0xffffbfc0;
  }
  (env->active_tc).DSPControl = tVar5;
  return uVar3;
}

Assistant:

target_ulong helper_extpdp(target_ulong ac, target_ulong size,
                           CPUMIPSState *env)
{
    int32_t start_pos;
    int sub;
    uint32_t temp;
    uint64_t acc;

    size = size & 0x1F;
    temp = 0;
    start_pos = get_DSPControl_pos(env);
    sub = start_pos - (size + 1);
    if (sub >= -1) {
        acc  = ((uint64_t)env->active_tc.HI[ac] << 32) |
               ((uint64_t)env->active_tc.LO[ac] & MIPSDSP_LLO);
        temp = extract64(acc, start_pos - size, size + 1);

        set_DSPControl_pos(sub, env);
        set_DSPControl_efi(0, env);
    } else {
        set_DSPControl_efi(1, env);
    }

    return (target_ulong)temp;
}